

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *centre,float radius,float amin,float amax,int num_segments)

{
  float fVar1;
  float fVar2;
  ImVec2 *pIVar3;
  ImVec2 *pIVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  
  if ((radius == 0.0) && (!NAN(radius))) {
    iVar7 = (this->_Path).Size;
    iVar8 = (this->_Path).Capacity;
    if (iVar7 == iVar8) {
      iVar7 = iVar7 + 1;
      if (iVar8 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar8 / 2 + iVar8;
      }
      if (iVar7 < iVar5) {
        iVar7 = iVar5;
      }
      if (iVar8 < iVar7) {
        pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar4,pIVar3,(long)(this->_Path).Size << 3);
        }
        ImGui::MemFree((this->_Path).Data);
        (this->_Path).Data = pIVar4;
        (this->_Path).Capacity = iVar7;
      }
    }
    iVar7 = (this->_Path).Size;
    (this->_Path).Size = iVar7 + 1;
    (this->_Path).Data[iVar7] = *centre;
  }
  lVar9 = (long)num_segments + (long)(this->_Path).Size + 1;
  iVar7 = (int)lVar9;
  if ((this->_Path).Capacity < iVar7) {
    pIVar4 = (ImVec2 *)ImGui::MemAlloc(lVar9 * 8);
    pIVar3 = (this->_Path).Data;
    if (pIVar3 != (ImVec2 *)0x0) {
      memcpy(pIVar4,pIVar3,(long)(this->_Path).Size << 3);
    }
    ImGui::MemFree((this->_Path).Data);
    (this->_Path).Data = pIVar4;
    (this->_Path).Capacity = iVar7;
  }
  if (-1 < num_segments) {
    iVar7 = 0;
    do {
      fVar11 = ((float)iVar7 / (float)num_segments) * (amax - amin) + amin;
      fVar1 = centre->x;
      fVar10 = cosf(fVar11);
      fVar2 = centre->y;
      fVar11 = sinf(fVar11);
      iVar8 = (this->_Path).Size;
      iVar5 = (this->_Path).Capacity;
      if (iVar8 == iVar5) {
        if (iVar5 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar5 / 2 + iVar5;
        }
        iVar8 = iVar8 + 1;
        if (iVar8 < iVar6) {
          iVar8 = iVar6;
        }
        if (iVar5 < iVar8) {
          pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
          pIVar3 = (this->_Path).Data;
          if (pIVar3 != (ImVec2 *)0x0) {
            memcpy(pIVar4,pIVar3,(long)(this->_Path).Size << 3);
          }
          ImGui::MemFree((this->_Path).Data);
          (this->_Path).Data = pIVar4;
          (this->_Path).Capacity = iVar8;
        }
      }
      pIVar3 = (this->_Path).Data;
      iVar8 = (this->_Path).Size;
      (this->_Path).Size = iVar8 + 1;
      pIVar3[iVar8].x = fVar10 * radius + fVar1;
      pIVar3[iVar8].y = fVar11 * radius + fVar2;
      iVar7 = iVar7 + 1;
    } while (num_segments + 1 != iVar7);
  }
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& centre, float radius, float amin, float amax, int num_segments)
{
    if (radius == 0.0f)
        _Path.push_back(centre);
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = amin + ((float)i / (float)num_segments) * (amax - amin);
        _Path.push_back(ImVec2(centre.x + cosf(a) * radius, centre.y + sinf(a) * radius));
    }
}